

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  TestPartResult *pTVar1;
  ostream *poVar2;
  int iVar3;
  size_t in_RDX;
  size_t width;
  int i;
  int iVar4;
  internal *piVar5;
  int i_1;
  int iVar6;
  string kIndent;
  string location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string message;
  
  Indent_abi_cxx11_(&kIndent,(internal *)0xa,in_RDX);
  iVar4 = 0;
  iVar6 = 0;
  while( true ) {
    iVar3 = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= iVar4) break;
    pTVar1 = TestResult::GetTestPartResult(result,iVar4);
    if (pTVar1->type_ - kNonFatalFailure < 2) {
      std::operator<<(stream,",\n");
      if (iVar6 == 0) {
        poVar2 = std::operator<<(stream,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"\"");
        poVar2 = std::operator<<(poVar2,"failures");
        std::operator<<(poVar2,"\": [\n");
      }
      piVar5 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (piVar5 != (internal *)0x0) {
        piVar5 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      iVar6 = iVar6 + 1;
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,piVar5,(char *)(ulong)(uint)pTVar1->line_number_,iVar3);
      std::operator+(&local_90,&location,"\n");
      std::operator+(&local_70,&local_90,(pTVar1->message_)._M_dataplus._M_p);
      EscapeJson(&message,&local_70);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      poVar2 = std::operator<<(stream,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"  {\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"failure\": \"");
      poVar2 = std::operator<<(poVar2,(string *)&message);
      poVar2 = std::operator<<(poVar2,"\",\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"type\": \"\"\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      std::operator<<(poVar2,"  }");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    iVar4 = iVar4 + 1;
  }
  if (0 < iVar6) {
    poVar2 = std::operator<<(stream,"\n");
    poVar2 = std::operator<<(poVar2,(string *)&kIndent);
    std::operator<<(poVar2,"]");
  }
  iVar4 = 0;
  iVar6 = 0;
  while( true ) {
    iVar3 = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= iVar6) break;
    pTVar1 = TestResult::GetTestPartResult(result,iVar6);
    if (pTVar1->type_ == kSkip) {
      std::operator<<(stream,",\n");
      if (iVar4 == 0) {
        poVar2 = std::operator<<(stream,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"\"");
        poVar2 = std::operator<<(poVar2,"skipped");
        std::operator<<(poVar2,"\": [\n");
      }
      piVar5 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (piVar5 != (internal *)0x0) {
        piVar5 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      iVar4 = iVar4 + 1;
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,piVar5,(char *)(ulong)(uint)pTVar1->line_number_,iVar3);
      std::operator+(&local_90,&location,"\n");
      std::operator+(&local_70,&local_90,(pTVar1->message_)._M_dataplus._M_p);
      EscapeJson(&message,&local_70);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      poVar2 = std::operator<<(stream,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"  {\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"message\": \"");
      poVar2 = std::operator<<(poVar2,(string *)&message);
      poVar2 = std::operator<<(poVar2,"\"\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      std::operator<<(poVar2,"  }");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    iVar6 = iVar6 + 1;
  }
  if (0 < iVar4) {
    poVar2 = std::operator<<(stream,"\n");
    poVar2 = std::operator<<(poVar2,(string *)&kIndent);
    std::operator<<(poVar2,"]");
  }
  poVar2 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&location,(internal *)0x8,width);
  poVar2 = std::operator<<(poVar2,(string *)&location);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}